

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

uint32_t lzma_mf_bt2_find(lzma_mf *mf,lzma_match *matches)

{
  uint32_t cur_match_00;
  uint16_t uVar1;
  uint32_t pos_00;
  uint8_t *buf;
  lzma_match *plVar2;
  uint32_t cur_match;
  uint32_t hash_value;
  uint32_t matches_count;
  uint32_t pos;
  uint8_t *cur;
  uint32_t len_limit;
  lzma_match *matches_local;
  lzma_mf *mf_local;
  
  cur._4_4_ = mf_avail(mf);
  if (cur._4_4_ < mf->nice_len) {
    if ((cur._4_4_ < 2) || (mf->action == LZMA_SYNC_FLUSH)) {
      if (mf->action != LZMA_RUN) {
        move_pending(mf);
        return 0;
      }
      __assert_fail("mf->action != LZMA_RUN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                    ,0x24d,"uint32_t lzma_mf_bt2_find(lzma_mf *, lzma_match *)");
    }
  }
  else {
    cur._4_4_ = mf->nice_len;
  }
  buf = mf_ptr(mf);
  pos_00 = mf->read_pos + mf->offset;
  uVar1 = read16ne(buf);
  cur_match_00 = mf->hash[(uint)uVar1];
  mf->hash[(uint)uVar1] = pos_00;
  plVar2 = bt_find_func(cur._4_4_,pos_00,buf,cur_match_00,mf->depth,mf->son,mf->cyclic_pos,
                        mf->cyclic_size,matches,1);
  move_pos(mf);
  return (uint32_t)((long)plVar2 - (long)matches >> 3);
}

Assistant:

extern uint32_t
lzma_mf_bt2_find(lzma_mf *mf, lzma_match *matches)
{
	header_find(true, 2);

	hash_2_calc();

	const uint32_t cur_match = mf->hash[hash_value];
	mf->hash[hash_value] = pos;

	bt_find(1);
}